

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.hpp
# Opt level: O2

void __thiscall
duckdb::KeyValueSecret::KeyValueSecret
          (KeyValueSecret *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *prefix_paths,string *type,string *provider,string *name)

{
  _Rb_tree_header *p_Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0 [24];
  string local_88;
  string local_68;
  string local_48;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_a0,&prefix_paths->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  ::std::__cxx11::string::string((string *)&local_68,(string *)type);
  ::std::__cxx11::string::string((string *)&local_88,(string *)provider);
  ::std::__cxx11::string::string((string *)&local_48,(string *)name);
  BaseSecret::BaseSecret
            (&this->super_BaseSecret,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)local_a0,&local_68,&local_88,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_a0);
  (this->super_BaseSecret)._vptr_BaseSecret = (_func_int **)&PTR__KeyValueSecret_0177eae8;
  p_Var1 = &(this->secret_map)._M_t._M_impl.super__Rb_tree_header;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->redact_keys)._M_h._M_buckets = &(this->redact_keys)._M_h._M_single_bucket;
  (this->redact_keys)._M_h._M_bucket_count = 1;
  (this->redact_keys)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->redact_keys)._M_h._M_element_count = 0;
  (this->redact_keys)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->redact_keys)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->redact_keys)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_BaseSecret).serializable = true;
  return;
}

Assistant:

KeyValueSecret(const vector<string> &prefix_paths, const string &type, const string &provider, const string &name)
	    : BaseSecret(prefix_paths, type, provider, name) {
		D_ASSERT(!type.empty());
		serializable = true;
	}